

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

size_t quantize_iq3_xxs(float *src,void *dst,int64_t nrow,int64_t n_per_row,float *quant_weights)

{
  long in_RCX;
  long in_RDX;
  int64_t row;
  char *qrow;
  int64_t nblock;
  float *in_stack_000003e0;
  int64_t in_stack_000003e8;
  void *in_stack_000003f0;
  float *in_stack_000003f8;
  int in_stack_00000404;
  long local_40;
  
  if (in_RCX % 0x100 != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-quants.c"
               ,0xeb2,"GGML_ASSERT(%s) failed","n_per_row%QK_K == 0");
  }
  for (local_40 = 0; local_40 < in_RDX; local_40 = local_40 + 1) {
    quantize_row_iq3_xxs_impl
              (in_stack_00000404,in_stack_000003f8,in_stack_000003f0,in_stack_000003e8,
               in_stack_000003e0);
  }
  return in_RDX * (in_RCX / 0x100) * 0x62;
}

Assistant:

size_t quantize_iq3_xxs(const float * GGML_RESTRICT src, void * GGML_RESTRICT dst, int64_t nrow, int64_t n_per_row, const float * quant_weights) {
    GGML_ASSERT(n_per_row%QK_K == 0);
    int64_t nblock = n_per_row/QK_K;
    char * qrow = (char *)dst;
    for (int64_t row = 0; row < nrow; ++row) {
        quantize_row_iq3_xxs_impl(256, src, qrow, n_per_row, quant_weights);
        src += n_per_row;
        qrow += nblock*sizeof(block_iq3_xxs);
    }
    return nrow * nblock * sizeof(block_iq3_xxs);
}